

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_transcoder::get_image_level_desc
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index,uint32_t *orig_width,uint32_t *orig_height,uint32_t *total_blocks)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long lVar5;
  uint in_ECX;
  long in_RSI;
  undefined4 in_R8D;
  uint32_t *in_R9;
  uint32_t *in_stack_00000008;
  int *in_stack_00000010;
  basis_slice_desc *slice_desc;
  basis_slice_desc *pSlice_descs;
  basis_file_header *pHeader;
  int slice_index;
  packed_uint<4U> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  bVar1 = validate_header_quick
                    ((basisu_transcoder *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0,(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
  ;
  if (bVar1) {
    iVar2 = find_first_slice_index
                      ((basisu_transcoder *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_R9,
                       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                       (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (iVar2 < 0) {
      local_1 = false;
    }
    else {
      uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 0x11));
      if (in_ECX < uVar3) {
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffffb0);
        lVar5 = in_RSI + (ulong)uVar3 + (long)iVar2 * 0x17;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar5 + 5));
        *in_R9 = uVar3;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar5 + 7));
        *in_stack_00000008 = uVar3;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar5 + 9));
        uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar5 + 0xb));
        *in_stack_00000010 = uVar3 * uVar4;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool basisu_transcoder::get_image_level_desc(const void* pData, uint32_t data_size, uint32_t image_index, uint32_t level_index, uint32_t& orig_width, uint32_t& orig_height, uint32_t& total_blocks) const
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_desc: header validation failed\n");
			return false;
		}

		int slice_index = find_first_slice_index(pData, data_size, image_index, level_index);
		if (slice_index < 0)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_desc: failed finding slice\n");
			return false;
		}

		const basis_file_header* pHeader = static_cast<const basis_file_header*>(pData);

		if (image_index >= pHeader->m_total_images)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_desc: invalid image_index\n");
			return false;
		}

		const basis_slice_desc* pSlice_descs = reinterpret_cast<const basis_slice_desc*>(static_cast<const uint8_t*>(pData) + pHeader->m_slice_desc_file_ofs);

		const basis_slice_desc& slice_desc = pSlice_descs[slice_index];

		orig_width = slice_desc.m_orig_width;
		orig_height = slice_desc.m_orig_height;
		total_blocks = slice_desc.m_num_blocks_x * slice_desc.m_num_blocks_y;

		return true;
	}